

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall t_netstd_generator::generate_service(t_netstd_generator *this,t_service *tservice)

{
  int *piVar1;
  int iVar2;
  pointer pcVar3;
  uint uVar4;
  long *plVar5;
  ostream *poVar6;
  _Alloc_hider *p_Var7;
  int __fd;
  t_netstd_generator *this_00;
  _Alloc_hider _Var8;
  string f_service_name;
  ofstream_with_content_based_conditional_update f_service;
  string local_270;
  undefined1 local_250 [32];
  string local_230;
  _Alloc_hider *local_210;
  long local_208;
  _Alloc_hider local_200;
  long lStack_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  char local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  iVar2 = (this->super_t_oop_generator).super_t_generator.indent_;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  pcVar3 = (this->namespace_dir_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar3,pcVar3 + (this->namespace_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  p_Var7 = (_Alloc_hider *)(plVar5 + 2);
  if ((_Alloc_hider *)*plVar5 == p_Var7) {
    local_1c0._M_p = p_Var7->_M_p;
    lStack_1b8 = plVar5[3];
    local_1d0._M_allocated_capacity = (size_type)&local_1c0;
  }
  else {
    local_1c0._M_p = p_Var7->_M_p;
    local_1d0._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar5;
  }
  local_1d0._8_8_ = plVar5[1];
  *plVar5 = (long)p_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_1d0._M_local_buf);
  local_210 = &local_200;
  p_Var7 = (_Alloc_hider *)(plVar5 + 2);
  if ((_Alloc_hider *)*plVar5 == p_Var7) {
    local_200._M_p = p_Var7->_M_p;
    lStack_1f8 = plVar5[3];
  }
  else {
    local_200._M_p = p_Var7->_M_p;
    local_210 = (_Alloc_hider *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)p_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Alloc_hider *)local_1d0._M_allocated_capacity != &local_1c0) {
    operator_delete((void *)local_1d0._M_allocated_capacity);
  }
  paVar9 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar9) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  std::__cxx11::string::string((string *)&local_270,(char *)local_210,(allocator *)local_250);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  local_140 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar9) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (0 < (this->super_t_oop_generator).super_t_generator.indent_) {
    (this->super_t_oop_generator).super_t_generator.indent_ = 0;
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_270,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,local_270._M_dataplus._M_p,local_270._M_string_length);
  netstd_type_usings_abi_cxx11_((string *)local_250,this);
  this_00 = (t_netstd_generator *)local_250._0_8_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_250._0_8_,local_250._8_8_);
  netstd_thrift_usings_abi_cxx11_(&local_230,this_00);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((t_netstd_generator *)local_250._0_8_ != (t_netstd_generator *)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar9) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  start_netstd_namespace(this,(ostream *)&local_1d0);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"public partial class ",0x15);
  pcVar3 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_1f0._M_allocated_capacity = (size_type)local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar3,
             pcVar3 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  normalize_name((string *)local_250,this,(string *)&local_1f0,false);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_250._0_8_,local_250._8_8_);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((t_netstd_generator *)local_250._0_8_ != (t_netstd_generator *)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_);
  }
  if ((char *)local_1f0._M_allocated_capacity != local_1e0) {
    operator_delete((void *)local_1f0._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  generate_service_interface(this,(ostream *)&local_1d0,tservice);
  generate_service_client(this,(ostream *)&local_1d0,tservice);
  generate_service_server(this,(ostream *)&local_1d0,tservice);
  generate_service_helpers(this,(ostream *)&local_1d0,tservice);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  _Var8 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  __fd = (int)_Var8._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((this->namespace_name_)._M_string_length != 0) {
    paVar9 = &local_1d0;
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)paVar9);
    __fd = (int)paVar9;
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0,__fd);
  uVar4 = iVar2 - (this->super_t_oop_generator).super_t_generator.indent_;
  if (uVar4 != 0) {
    pverbose("Wrong indent count in %s: difference = %i \n","generate_service.",(ulong)uVar4);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_service(t_service* tservice)
{
    int ic = indent_count();

    string f_service_name = namespace_dir_ + "/" + service_name_ + ".cs";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_service_name.c_str());

    reset_indent();
    f_service << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    start_netstd_namespace(f_service);

    f_service << indent() << "public partial class " << normalize_name(service_name_) << endl
              << indent() << "{" << endl;
    indent_up();

    generate_service_interface(f_service, tservice);
    generate_service_client(f_service, tservice);
    generate_service_server(f_service, tservice);
    generate_service_helpers(f_service, tservice);

    indent_down();
    f_service << indent() << "}" << endl;

    end_netstd_namespace(f_service);
    f_service.close();

    indent_validate(ic, "generate_service.");
}